

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseF64Value
          (JSONParser *this,uint64_t *out_value,ExpectedNan *out_nan,string_view value_str,
          AllowExpected allow_expected)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  Result result;
  char *pcVar2;
  string_view v;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_80;
  JSONParser *local_70;
  char *local_68;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_60;
  JSONParser *local_50;
  char *local_48;
  AllowExpected local_3c;
  ExpectedNan *pEStack_38;
  AllowExpected allow_expected_local;
  ExpectedNan *out_nan_local;
  uint64_t *out_value_local;
  JSONParser *this_local;
  string_view value_str_local;
  
  pcVar2 = value_str._M_str;
  this_local = (JSONParser *)value_str._M_len;
  local_3c = allow_expected;
  pEStack_38 = out_nan;
  out_nan_local = (ExpectedNan *)out_value;
  out_value_local = (uint64_t *)this;
  value_str_local._M_len = (size_t)pcVar2;
  if (allow_expected == Yes) {
    *out_value = 0;
    local_50 = this_local;
    local_48 = pcVar2;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"nan:canonical");
    __x_00._M_str = local_48;
    __x_00._M_len = (size_t)local_50;
    bVar1 = std::operator==(__x_00,local_60);
    if (bVar1) {
      *pEStack_38 = Canonical;
      wabt::Result::Result((Result *)((long)&value_str_local._M_str + 4),Ok);
      return (Result)value_str_local._M_str._4_4_;
    }
    local_70 = this_local;
    local_68 = (char *)value_str_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"nan:arithmetic");
    __x._M_str = local_68;
    __x._M_len = (size_t)local_70;
    bVar1 = std::operator==(__x,local_80);
    if (bVar1) {
      *pEStack_38 = Arithmetic;
      wabt::Result::Result((Result *)((long)&value_str_local._M_str + 4),Ok);
      return (Result)value_str_local._M_str._4_4_;
    }
  }
  *pEStack_38 = None;
  v._M_str = (char *)out_nan_local;
  v._M_len = value_str_local._M_len;
  result = wabt::ParseInt64((wabt *)this_local,v,(uint64_t *)0x0,(ParseIntType)pcVar2);
  bVar1 = wabt::Failed(result);
  if (bVar1) {
    PrintError(this,"invalid f64 literal");
    wabt::Result::Result((Result *)((long)&value_str_local._M_str + 4),Error);
  }
  else {
    wabt::Result::Result((Result *)((long)&value_str_local._M_str + 4),Ok);
  }
  return (Result)value_str_local._M_str._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseF64Value(uint64_t* out_value,
                                       ExpectedNan* out_nan,
                                       std::string_view value_str,
                                       AllowExpected allow_expected) {
  if (allow_expected == AllowExpected::Yes) {
    *out_value = 0;
    if (value_str == "nan:canonical") {
      *out_nan = ExpectedNan::Canonical;
      return wabt::Result::Ok;
    } else if (value_str == "nan:arithmetic") {
      *out_nan = ExpectedNan::Arithmetic;
      return wabt::Result::Ok;
    }
  }

  *out_nan = ExpectedNan::None;
  if (Failed(ParseInt64(value_str, out_value, ParseIntType::UnsignedOnly))) {
    PrintError("invalid f64 literal");
    return wabt::Result::Error;
  }
  return wabt::Result::Ok;
}